

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(expression_lhs<const_bool_&> *this)

{
  undefined8 *in_RSI;
  result *in_RDI;
  result *in_stack_ffffffffffffff48;
  result *passed_;
  result *this_00;
  bool *in_stack_ffffffffffffff78;
  undefined1 local_80 [71];
  byte local_39;
  
  local_39 = *(byte *)*in_RSI & 1;
  this_00 = (result *)local_80;
  passed_ = in_RDI;
  to_string<bool>(in_stack_ffffffffffffff78);
  std::__cxx11::string::string((string *)(local_80 + 0x20),(string *)this_00);
  result::result<bool>(this_00,&passed_->passed,(text *)in_RDI);
  result::result(in_RDI,in_stack_ffffffffffffff48);
  result::~result((result *)0x12da98);
  std::__cxx11::string::~string((string *)(local_80 + 0x20));
  std::__cxx11::string::~string((string *)local_80);
  return passed_;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }